

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O1

ans_reorder_fold_encode<2U> *
ans_reorder_fold_encode<2U>::create
          (ans_reorder_fold_encode<2U> *__return_storage_ptr__,uint32_t *in_u32,size_t n)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  long *plVar1;
  pointer puVar2;
  iterator __position;
  pointer puVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  pointer ppVar10;
  pointer ppVar11;
  void *__s;
  ulong uVar12;
  size_t sVar13;
  long lVar14;
  uint64_t uVar15;
  uint *__args;
  uint64_t *puVar16;
  long lVar17;
  uint uVar18;
  long lVar20;
  uint uVar21;
  undefined8 unaff_R12;
  int iVar22;
  int iVar23;
  ulong __n;
  ushort uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqs;
  vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
  unmapped_freqs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_> local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  ulong local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  uint uVar19;
  
  auVar33 = ZEXT1664((undefined1  [16])0x0);
  auVar26 = vmovdqu64_avx512f(auVar33);
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->table).
    super__Vector_base<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar26;
  auVar26 = vmovdqu64_avx512f(auVar33);
  __return_storage_ptr__->nfreqs =
       (vector<unsigned_int,_std::allocator<unsigned_int>_>)auVar26._0_24_;
  __return_storage_ptr__->table =
       (vector<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>)auVar26._24_24_;
  (__return_storage_ptr__->mapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)auVar26._48_8_;
  (__return_storage_ptr__->mapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)auVar26._56_8_;
  if (n == 0) {
    uVar12 = 0;
  }
  else {
    auVar26 = vpbroadcastq_avx512f();
    uVar12 = 0;
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar29 = vmovdqa64_avx512f(auVar33);
      auVar33 = vpbroadcastq_avx512f();
      auVar30 = vporq_avx512f(auVar33,auVar27);
      auVar33 = vporq_avx512f(auVar33,auVar28);
      uVar7 = vpcmpuq_avx512f(auVar33,auVar26,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar30,auVar26,2);
      bVar9 = (byte)uVar7;
      uVar24 = CONCAT11(bVar9,bVar8);
      auVar33 = vmovdqu32_avx512f(*(undefined1 (*) [64])(in_u32 + uVar12));
      auVar30._4_4_ = (uint)((byte)(uVar24 >> 1) & 1) * auVar33._4_4_;
      auVar30._0_4_ = (uint)(bVar8 & 1) * auVar33._0_4_;
      auVar30._8_4_ = (uint)((byte)(uVar24 >> 2) & 1) * auVar33._8_4_;
      auVar30._12_4_ = (uint)((byte)(uVar24 >> 3) & 1) * auVar33._12_4_;
      auVar30._16_4_ = (uint)((byte)(uVar24 >> 4) & 1) * auVar33._16_4_;
      auVar30._20_4_ = (uint)((byte)(uVar24 >> 5) & 1) * auVar33._20_4_;
      auVar30._24_4_ = (uint)((byte)(uVar24 >> 6) & 1) * auVar33._24_4_;
      auVar30._28_4_ = (uint)((byte)(uVar24 >> 7) & 1) * auVar33._28_4_;
      auVar30._32_4_ = (uint)(bVar9 & 1) * auVar33._32_4_;
      auVar30._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar33._36_4_;
      auVar30._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar33._40_4_;
      auVar30._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar33._44_4_;
      auVar30._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar33._48_4_;
      auVar30._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar33._52_4_;
      auVar30._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar33._56_4_;
      auVar30._60_4_ = (uint)(bVar9 >> 7) * auVar33._60_4_;
      auVar33 = vpmaxud_avx512f(auVar30,auVar29);
      uVar12 = uVar12 + 0x10;
    } while ((n + 0xf & 0xfffffffffffffff0) != uVar12);
    auVar33 = vmovdqa32_avx512f(auVar33);
    auVar26._0_4_ = (uint)(bVar8 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar29._0_4_;
    bVar4 = (bool)((byte)(uVar24 >> 1) & 1);
    auVar26._4_4_ = (uint)bVar4 * auVar33._4_4_ | (uint)!bVar4 * auVar29._4_4_;
    bVar4 = (bool)((byte)(uVar24 >> 2) & 1);
    auVar26._8_4_ = (uint)bVar4 * auVar33._8_4_ | (uint)!bVar4 * auVar29._8_4_;
    bVar4 = (bool)((byte)(uVar24 >> 3) & 1);
    auVar26._12_4_ = (uint)bVar4 * auVar33._12_4_ | (uint)!bVar4 * auVar29._12_4_;
    bVar4 = (bool)((byte)(uVar24 >> 4) & 1);
    auVar26._16_4_ = (uint)bVar4 * auVar33._16_4_ | (uint)!bVar4 * auVar29._16_4_;
    bVar4 = (bool)((byte)(uVar24 >> 5) & 1);
    auVar26._20_4_ = (uint)bVar4 * auVar33._20_4_ | (uint)!bVar4 * auVar29._20_4_;
    bVar4 = (bool)((byte)(uVar24 >> 6) & 1);
    auVar26._24_4_ = (uint)bVar4 * auVar33._24_4_ | (uint)!bVar4 * auVar29._24_4_;
    bVar4 = (bool)((byte)(uVar24 >> 7) & 1);
    auVar26._28_4_ = (uint)bVar4 * auVar33._28_4_ | (uint)!bVar4 * auVar29._28_4_;
    auVar26._32_4_ = (uint)(bVar9 & 1) * auVar33._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar29._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar26._36_4_ = (uint)bVar4 * auVar33._36_4_ | (uint)!bVar4 * auVar29._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar26._40_4_ = (uint)bVar4 * auVar33._40_4_ | (uint)!bVar4 * auVar29._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar26._44_4_ = (uint)bVar4 * auVar33._44_4_ | (uint)!bVar4 * auVar29._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar26._48_4_ = (uint)bVar4 * auVar33._48_4_ | (uint)!bVar4 * auVar29._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar26._52_4_ = (uint)bVar4 * auVar33._52_4_ | (uint)!bVar4 * auVar29._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar26._56_4_ = (uint)bVar4 * auVar33._56_4_ | (uint)!bVar4 * auVar29._56_4_;
    auVar26._60_4_ =
         (uint)(bVar9 >> 7) * auVar33._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar29._60_4_;
    auVar25 = vextracti64x4_avx512f(auVar26,1);
    auVar26 = vpmaxud_avx512f(auVar26,ZEXT3264(auVar25));
    auVar5 = vpmaxud_avx(auVar26._0_16_,auVar26._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpmaxud_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpmaxud_avx(auVar5,auVar6);
    uVar12 = CONCAT44((int)((ulong)unaff_R12 >> 0x20),auVar5._0_4_);
  }
  __n = (ulong)((int)uVar12 + 1);
  std::vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>::
  vector(&local_70,__n,(allocator_type *)&local_88);
  ppVar10 = local_70.
            super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppVar11 = local_70.
            super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (n != 0) {
    sVar13 = 0;
    do {
      uVar21 = in_u32[sVar13];
      local_70.
      super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar21].first =
           local_70.
           super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar21].first + -1;
      local_70.
      super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar21].second = uVar21;
      sVar13 = sVar13 + 1;
    } while (n != sVar13);
  }
  local_50 = uVar12;
  if (local_70.
      super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_70.
      super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<long,unsigned_int>*,std::vector<std::pair<long,unsigned_int>,std::allocator<std::pair<long,unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_70.
               super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_70.
               super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_70.
                                  super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_70.
                                  super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long,unsigned_int>*,std::vector<std::pair<long,unsigned_int>,std::allocator<std::pair<long,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar11,ppVar10);
  }
  __return_storage_ptr__->sigma = 0;
  if ((long)local_70.
            super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_70.
            super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    uVar15 = __return_storage_ptr__->sigma;
    lVar14 = (long)local_70.
                   super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_70.
                   super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar14 = lVar14 + (ulong)(lVar14 == 0);
    ppVar11 = local_70.
              super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar15 = uVar15 + 1;
      if (ppVar11->first == 0) break;
      __return_storage_ptr__->sigma = uVar15;
      ppVar11 = ppVar11 + 1;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  this = &__return_storage_ptr__->mapping;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this,__n);
  local_58 = this;
  if (__return_storage_ptr__->sigma < 0x200) {
    if (__n != 0) {
      puVar2 = (this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      auVar26 = vpbroadcastq_avx512f();
      auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar28 = vpmovsxbd_avx512f(_DAT_001a9340);
      lVar14 = 0;
      auVar29 = vpbroadcastq_avx512f(ZEXT816(0x10));
      auVar30 = vpbroadcastd_avx512f(ZEXT416(0x10));
      do {
        vpcmpuq_avx512f(auVar27,auVar26,2);
        vpcmpuq_avx512f(auVar33,auVar26,2);
        auVar31 = vmovdqu32_avx512f(auVar28);
        *(undefined1 (*) [64])((long)puVar2 + lVar14) = auVar31;
        auVar27 = vpaddq_avx512f(auVar27,auVar29);
        auVar33 = vpaddq_avx512f(auVar33,auVar29);
        auVar28 = vpaddd_avx512f(auVar28,auVar30);
        lVar14 = lVar14 + 0x40;
      } while ((__n + 0xf >> 4) * 0x40 != lVar14);
    }
  }
  else {
    puVar2 = (this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    auVar26 = vpbroadcastq_avx512f();
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar28 = vpmovsxbd_avx512f(_DAT_001a9340);
    lVar14 = 0;
    auVar29 = vpbroadcastd_avx512f(ZEXT416(0x200));
    auVar30 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar31 = vpbroadcastd_avx512f(ZEXT416(0x10));
    do {
      vpcmpuq_avx512f(auVar27,auVar26,2);
      vpcmpuq_avx512f(auVar33,auVar26,2);
      auVar32 = vpaddd_avx512f(auVar28,auVar29);
      auVar32 = vmovdqu32_avx512f(auVar32);
      *(undefined1 (*) [64])((long)puVar2 + lVar14) = auVar32;
      auVar27 = vpaddq_avx512f(auVar27,auVar30);
      auVar33 = vpaddq_avx512f(auVar33,auVar30);
      auVar28 = vpaddd_avx512f(auVar28,auVar31);
      lVar14 = lVar14 + 0x40;
    } while (((local_50 & 0xffffffff) + 0x10 >> 4) * 0x40 != lVar14);
    lVar14 = 8;
    uVar21 = 0;
    do {
      __args = (uint *)((long)&(local_70.
                                super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->first + lVar14);
      (__return_storage_ptr__->mapping).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start
      [*(uint *)((long)&(local_70.
                         super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->first + lVar14)] = uVar21;
      __position._M_current =
           (__return_storage_ptr__->most_frequent).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->most_frequent).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   &__return_storage_ptr__->most_frequent,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        (__return_storage_ptr__->most_frequent).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar14 = lVar14 + 0x10;
      uVar21 = uVar21 + 1;
    } while (lVar14 != 0x2008);
  }
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = operator_new(0x4000);
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)__s;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)__s;
  uVar21 = 0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)((long)__s + 0x4000);
  memset(__s,0,0x4000);
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)((long)__s + 0x4000);
  if (n != 0) {
    puVar2 = (local_58->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar13 = 0;
    uVar21 = 0;
    do {
      uVar19 = puVar2[in_u32[sVar13]];
      iVar22 = 0;
      uVar18 = uVar19;
      iVar23 = 0;
      if (0x1ff < uVar19) {
        do {
          uVar18 = uVar19 >> 8;
          iVar22 = iVar22 + 0x1fe;
          bVar4 = 0x1ffff < uVar19;
          uVar19 = uVar18;
          iVar23 = iVar22;
        } while (bVar4);
      }
      uVar18 = iVar23 + uVar18;
      plVar1 = (long *)((long)__s + (ulong)uVar18 * 8);
      *plVar1 = *plVar1 + 1;
      if (uVar18 <= uVar21) {
        uVar18 = uVar21;
      }
      uVar21 = uVar18;
      sVar13 = sVar13 + 1;
    } while (sVar13 != n);
  }
  adjust_freqs(&local_48,&local_88,uVar21,true,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&__return_storage_ptr__->nfreqs,&local_48);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 == puVar3) {
    uVar15 = 0;
  }
  else {
    auVar26 = vpbroadcastq_avx512f();
    auVar26 = vpsrlq_avx512f(auVar26,2);
    auVar28 = ZEXT1664((undefined1  [16])0x0);
    uVar12 = 0;
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar29 = vmovdqa64_avx512f(auVar28);
      auVar28 = vpbroadcastq_avx512f();
      auVar30 = vporq_avx512f(auVar28,auVar33);
      auVar28 = vporq_avx512f(auVar28,auVar27);
      uVar7 = vpcmpuq_avx512f(auVar28,auVar26,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar30,auVar26,2);
      bVar9 = (byte)uVar7;
      uVar24 = CONCAT11(bVar9,bVar8);
      auVar28 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar2 + uVar12));
      auVar31._4_4_ = (uint)((byte)(uVar24 >> 1) & 1) * auVar28._4_4_;
      auVar31._0_4_ = (uint)(bVar8 & 1) * auVar28._0_4_;
      auVar31._8_4_ = (uint)((byte)(uVar24 >> 2) & 1) * auVar28._8_4_;
      auVar31._12_4_ = (uint)((byte)(uVar24 >> 3) & 1) * auVar28._12_4_;
      auVar31._16_4_ = (uint)((byte)(uVar24 >> 4) & 1) * auVar28._16_4_;
      auVar31._20_4_ = (uint)((byte)(uVar24 >> 5) & 1) * auVar28._20_4_;
      auVar31._24_4_ = (uint)((byte)(uVar24 >> 6) & 1) * auVar28._24_4_;
      auVar31._28_4_ = (uint)((byte)(uVar24 >> 7) & 1) * auVar28._28_4_;
      auVar31._32_4_ = (uint)(bVar9 & 1) * auVar28._32_4_;
      auVar31._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar28._36_4_;
      auVar31._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar28._40_4_;
      auVar31._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar28._44_4_;
      auVar31._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar28._48_4_;
      auVar31._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar28._52_4_;
      auVar31._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar28._56_4_;
      auVar31._60_4_ = (uint)(bVar9 >> 7) * auVar28._60_4_;
      auVar28 = vpaddd_avx512f(auVar31,auVar29);
      uVar12 = uVar12 + 0x10;
    } while ((((ulong)((long)puVar3 + (-4 - (long)puVar2)) >> 2) + 0x10 & 0xfffffffffffffff0) !=
             uVar12);
    auVar26 = vmovdqa32_avx512f(auVar28);
    auVar33._0_4_ = (uint)(bVar8 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar29._0_4_;
    bVar4 = (bool)((byte)(uVar24 >> 1) & 1);
    auVar33._4_4_ = (uint)bVar4 * auVar26._4_4_ | (uint)!bVar4 * auVar29._4_4_;
    bVar4 = (bool)((byte)(uVar24 >> 2) & 1);
    auVar33._8_4_ = (uint)bVar4 * auVar26._8_4_ | (uint)!bVar4 * auVar29._8_4_;
    bVar4 = (bool)((byte)(uVar24 >> 3) & 1);
    auVar33._12_4_ = (uint)bVar4 * auVar26._12_4_ | (uint)!bVar4 * auVar29._12_4_;
    bVar4 = (bool)((byte)(uVar24 >> 4) & 1);
    auVar33._16_4_ = (uint)bVar4 * auVar26._16_4_ | (uint)!bVar4 * auVar29._16_4_;
    bVar4 = (bool)((byte)(uVar24 >> 5) & 1);
    auVar33._20_4_ = (uint)bVar4 * auVar26._20_4_ | (uint)!bVar4 * auVar29._20_4_;
    bVar4 = (bool)((byte)(uVar24 >> 6) & 1);
    auVar33._24_4_ = (uint)bVar4 * auVar26._24_4_ | (uint)!bVar4 * auVar29._24_4_;
    bVar4 = (bool)((byte)(uVar24 >> 7) & 1);
    auVar33._28_4_ = (uint)bVar4 * auVar26._28_4_ | (uint)!bVar4 * auVar29._28_4_;
    auVar33._32_4_ = (uint)(bVar9 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar29._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar33._36_4_ = (uint)bVar4 * auVar26._36_4_ | (uint)!bVar4 * auVar29._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar33._40_4_ = (uint)bVar4 * auVar26._40_4_ | (uint)!bVar4 * auVar29._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar33._44_4_ = (uint)bVar4 * auVar26._44_4_ | (uint)!bVar4 * auVar29._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar33._48_4_ = (uint)bVar4 * auVar26._48_4_ | (uint)!bVar4 * auVar29._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar33._52_4_ = (uint)bVar4 * auVar26._52_4_ | (uint)!bVar4 * auVar29._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar33._56_4_ = (uint)bVar4 * auVar26._56_4_ | (uint)!bVar4 * auVar29._56_4_;
    auVar33._60_4_ =
         (uint)(bVar9 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar29._60_4_;
    auVar25 = vextracti64x4_avx512f(auVar33,1);
    auVar26 = vpaddd_avx512f(auVar33,ZEXT3264(auVar25));
    auVar5 = vpaddd_avx(auVar26._0_16_,auVar26._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpaddd_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpaddd_avx(auVar5,auVar6);
    uVar15 = (uint64_t)auVar5._0_4_;
  }
  __return_storage_ptr__->frame_size = uVar15;
  std::vector<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>::resize
            (&__return_storage_ptr__->table,(ulong)(uVar21 + 1));
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar14 = (long)(__return_storage_ptr__->nfreqs).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar2;
  if (lVar14 != 0) {
    lVar14 = lVar14 >> 2;
    puVar16 = &((__return_storage_ptr__->table).
                super__Vector_base<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>.
                _M_impl.super__Vector_impl_data._M_start)->sym_upper_bound;
    lVar17 = 0;
    lVar20 = 0;
    do {
      ((enc_entry_reorder_fold *)(puVar16 + -1))->freq = (uint16_t)puVar2[lVar17];
      *(uint32_t *)((long)puVar16 + -4) = (uint32_t)lVar20;
      lVar20 = lVar20 + (ulong)puVar2[lVar17];
      *puVar16 = (ulong)puVar2[lVar17] << 0x24;
      lVar17 = lVar17 + 1;
      puVar16 = puVar16 + 2;
    } while (lVar14 + (ulong)(lVar14 == 0) != lVar17);
  }
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.
      super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static ans_reorder_fold_encode create(const uint32_t* in_u32, size_t n)
    {
        ans_reorder_fold_encode model;

        // 1) identify most frequent syms
        uint32_t unmapped_max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            unmapped_max_sym = std::max(in_u32[i], unmapped_max_sym);
        }
        std::vector<std::pair<int64_t, uint32_t>> unmapped_freqs(
            unmapped_max_sym + 1);
        for (size_t i = 0; i < n; i++) {
            unmapped_freqs[in_u32[i]].first--;
            unmapped_freqs[in_u32[i]].second = in_u32[i];
        }
        std::sort(unmapped_freqs.begin(), unmapped_freqs.end());
        model.sigma = 0;
        for (size_t i = 0; i < unmapped_freqs.size(); i++) {
            if (unmapped_freqs[i].first == 0)
                break;
            model.sigma++;
        }
        size_t no_except_thres = 1 << (fidelity + 8 - 1);
        model.mapping.resize(unmapped_max_sym + 1);
        if (model.sigma < no_except_thres) {
            for (size_t i = 0; i < unmapped_max_sym + 1; i++) {
                model.mapping[i] = i;
            }
        } else {
            for (size_t i = 0; i <= unmapped_max_sym; i++) {
                model.mapping[i] = i + no_except_thres;
            }
            for (size_t i = 0; i < no_except_thres; i++) {
                model.mapping[unmapped_freqs[i].second] = i;
                model.most_frequent.push_back(unmapped_freqs[i].second);
            }
        }
        const uint32_t MAX_SIGMA = 1 << (fidelity + 8 + 1);
        std::vector<uint64_t> freqs(MAX_SIGMA, 0);
        uint32_t max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            auto mapped_u32
                = ans_reorder_fold_mapping<fidelity>(model.mapping[in_u32[i]]);
            freqs[mapped_u32]++;
            max_sym = std::max(mapped_u32, max_sym);
        }
        model.nfreqs = adjust_freqs(freqs, max_sym, true);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;
        model.table.resize(max_sym + 1);
        for (size_t sym = 0; sym < model.nfreqs.size(); sym++) {
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }